

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

void __thiscall UDMFParser::ParseLinedef(UDMFParser *this,line_t_conflict *ld,int index)

{
  side_t **ppsVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  byte *pbVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  DWORD DVar7;
  FName FVar8;
  bool bVar9;
  int iVar10;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  uint32_t *puVar14;
  FString *this_00;
  double dVar15;
  undefined1 auVar16 [16];
  FString tagstring;
  FString arg1str;
  FString arg0str;
  FString local_160;
  FName local_154;
  char *local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  FName key;
  int local_120;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 3;
  arg0str.Chars = FString::NullString.Nothing;
  arg1str.Chars = FString::NullString.Nothing;
  tagstring.Chars = FString::NullString.Nothing;
  uVar13 = 0;
  memset(ld,0,0x98);
  ld->alpha = 1.0;
  ld->portalindex = 0xffffffff;
  ld->sidedef[0] = (side_t *)0x0;
  DVar7 = level.flags2;
  ld->sidedef[1] = (side_t *)0x0;
  if ((level.flags2 >> 9 & 1) != 0) {
    ld->flags = 0x80000;
    uVar13 = 0x80000;
  }
  if ((DVar7 >> 10 & 1) != 0) {
    uVar13 = uVar13 | 0x100000;
    ld->flags = uVar13;
  }
  if ((DVar7 >> 0xb & 1) != 0) {
    ld->flags = uVar13 | 0x400000;
  }
  FScanner::MustGetToken((FScanner *)this,0x7b);
  ppsVar1 = ld->sidedef;
  puVar2 = &ld->flags;
  puVar3 = &ld->activation;
  local_138 = 0;
  local_148 = 0;
  local_140 = 0;
LAB_0045d303:
  bVar9 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (bVar9) {
    if (*(int *)(tagstring.Chars + -0xc) != 0) {
      FScanner::FScanner((FScanner *)&key);
      FString::AttachToOther(&local_160,&tagstring);
      FScanner::OpenString((FScanner *)&key,"tagstring",&local_160);
      FString::~FString(&local_160);
      while (bVar9 = FScanner::CheckNumber((FScanner *)&key), bVar9) {
        if (local_120 != 0) {
          FTagManager::AddLineID(&tagManager,index,local_120);
        }
      }
      FScanner::~FScanner((FScanner *)&key);
    }
    if (this->isTranslated == true) {
      uVar13 = ld->flags;
      key.Index = 0;
      uVar5 = ld->special;
      uVar6 = ld->args[0];
      auVar16._4_4_ = uVar6;
      auVar16._0_4_ = uVar5;
      auVar16._8_8_ = 0;
      pshuflw(auVar16,auVar16,0xe8);
      P_TranslateLineDef((line_t *)ld,(maplinedef_t *)&key,-1);
      *puVar2 = *puVar2 & 0x802200 | uVar13;
    }
    if (((local_140 & 1) != 0) && ((*puVar3 & 2) != 0)) {
      *puVar3 = *puVar3 & 0xffffffbd | 0x40;
    }
    if ((((local_148 & 1) != 0) && (ld->alpha == 1.0)) && (!NAN(ld->alpha))) {
      ld->alpha = 0.75;
    }
    if ((((local_138 & 1) != 0) && (ld->alpha == 65536.0)) && (!NAN(ld->alpha))) {
      ld->alpha = 0.25;
    }
    if (*ppsVar1 == (side_t *)0x0) {
      *ppsVar1 = (side_t *)0x1;
      Printf("Line %d has no first side.\n",(ulong)(uint)index);
    }
    if ((*(int *)(arg0str.Chars + -0xc) != 0) &&
       (((iVar10 = ld->special, iVar10 - 0x50U < 6 || (iVar10 == 0xe2)) || (iVar10 == 0)))) {
      FName::FName(&key,&arg0str);
      ld->args[0] = -key.Index;
    }
    if (*(int *)(arg1str.Chars + -0xc) != 0) {
      uVar13 = ld->special - 0x86;
      if (((uVar13 < 0x2d) && ((0x12000000002fU >> ((ulong)uVar13 & 0x3f) & 1) != 0)) ||
         (ld->special == 0)) {
        FName::FName(&key,&arg1str);
        ld->args[1] = -key.Index;
      }
    }
    if ((*puVar2 & 0x10200000) == 0x10000000) {
      Printf("Line %d has midtex3dimpassible without midtex3d.\n",(ulong)(uint)index);
    }
    FString::~FString(&tagstring);
    FString::~FString(&arg1str);
    FString::~FString(&arg0str);
    return;
  }
  UDMFParserBase::ParseKey((UDMFParserBase *)&key,SUB81(this,0),(bool *)0x0);
  puVar14 = puVar2;
  switch(key.Index) {
  case 0x168:
    lVar11 = 0x1680;
    goto LAB_0045d392;
  case 0x169:
    lVar11 = 0x1690;
    goto LAB_0045d48e;
  case 0x16a:
    lVar11 = 0x16a0;
    goto LAB_0045d482;
  case 0x16b:
    lVar11 = 0x16b0;
    goto LAB_0045d4a6;
  case 0x16c:
    lVar11 = 0x16c0;
    goto LAB_0045d44d;
  case 0x16d:
    lVar11 = 0x16d0;
    goto LAB_0045d459;
  case 0x16e:
    lVar11 = 0x16e0;
    iVar10 = 0x40;
    break;
  case 0x16f:
    iVar10 = 0x80;
    lVar11 = 0x16f0;
    break;
  case 0x170:
    iVar10 = 0x100;
    lVar11 = 0x1700;
    break;
  case 0x171:
  case 0x172:
  case 0x173:
  case 0x174:
  case 0x177:
  case 0x178:
  case 0x179:
  case 0x17a:
  case 0x17b:
    goto switchD_0045d34e_caseD_120;
  case 0x175:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0045d34e_caseD_120;
    iVar10 = 0x20000;
    lVar11 = 0x1750;
    break;
  case 0x176:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0045d34e_caseD_120;
    iVar10 = 0x40000;
    lVar11 = 0x1760;
    break;
  case 0x17c:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0045d34e_caseD_120;
    bVar9 = UDMFParserBase::CheckBool
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x17c].Text);
    local_138 = CONCAT71(extraout_var_01,bVar9);
    goto LAB_0045d303;
  case 0x17d:
    if (((this->super_UDMFParserBase).namespace_bits & 0x71) == 0) goto switchD_0045d34e_caseD_120;
    bVar9 = UDMFParserBase::CheckBool
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x17d].Text);
    local_140 = CONCAT71(extraout_var_00,bVar9);
    goto LAB_0045d303;
  default:
    switch(key.Index) {
    case 0x118:
    case 0x119:
    case 0x11a:
    case 0x11b:
    case 0x11c:
      iVar10 = UDMFParserBase::CheckInt
                         (&this->super_UDMFParserBase,
                          FName::NameData.NameArray[(uint)key.Index].Text);
      *(int *)((long)ld + (long)key.Index * 4 + -0x434) = iVar10;
      goto LAB_0045d303;
    case 0x11d:
      if (((this->super_UDMFParserBase).namespace_bits & 0x10) != 0) {
        pcVar12 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x11d].Text);
        this_00 = &arg0str;
LAB_0045d6fc:
        FString::operator=(this_00,pcVar12);
        goto LAB_0045d303;
      }
      break;
    case 0x11e:
      if (((this->super_UDMFParserBase).namespace_bits & 0x10) != 0) {
        pcVar12 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x11e].Text);
        this_00 = &arg1str;
        goto LAB_0045d6fc;
      }
      break;
    case 0x11f:
      iVar10 = UDMFParserBase::CheckInt
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[0x11f].Text);
      FTagManager::AddLineID(&tagManager,index,iVar10);
      goto LAB_0045d303;
    case 0x120:
      break;
    case 0x121:
      iVar10 = UDMFParserBase::CheckInt
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[0x121].Text);
      ld->v1 = (vertex_t *)(long)iVar10;
      goto LAB_0045d303;
    case 0x122:
      iVar10 = UDMFParserBase::CheckInt
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[0x122].Text);
      ld->v2 = (vertex_t *)(long)iVar10;
      goto LAB_0045d303;
    case 0x123:
      iVar10 = UDMFParserBase::CheckInt
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[0x123].Text);
      *ppsVar1 = (side_t *)(long)(iVar10 + 1);
      goto LAB_0045d303;
    case 0x124:
      iVar10 = UDMFParserBase::CheckInt
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[0x124].Text);
      ld->sidedef[1] = (side_t *)(long)(iVar10 + 1);
      goto LAB_0045d303;
    default:
      if (key.Index == 0xed) {
        uVar13 = UDMFParserBase::CheckInt
                           (&this->super_UDMFParserBase,FName::NameData.NameArray[0xed].Text);
        ld->special = uVar13;
        if (((this->super_UDMFParserBase).namespc.Index == 10) &&
           ((0x8c < uVar13 || ("\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar13] == '\0')))) {
          ld->special = 0;
        }
      }
      else {
        if ((key.Index != 0x159) || (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0))
        break;
        bVar9 = UDMFParserBase::CheckBool
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x159].Text);
        local_148 = CONCAT71(extraout_var,bVar9);
      }
      goto LAB_0045d303;
    }
switchD_0045d34e_caseD_120:
    if (this->isTranslated == false) {
      switch(key.Index) {
      case 0x17e:
        iVar10 = 0x200;
        lVar11 = 0x17e0;
        break;
      default:
        goto switchD_0045d5db_caseD_17f;
      case 0x182:
        lVar11 = 0x1820;
        puVar14 = puVar3;
LAB_0045d392:
        iVar10 = 1;
        break;
      case 0x183:
        lVar11 = 0x1830;
        puVar14 = puVar3;
LAB_0045d48e:
        iVar10 = 2;
        break;
      case 0x184:
        iVar10 = 0x400;
        lVar11 = 0x1840;
        puVar14 = puVar3;
        break;
      case 0x185:
        lVar11 = 0x1850;
        puVar14 = puVar3;
LAB_0045d482:
        iVar10 = 4;
        break;
      case 0x186:
        lVar11 = 0x1860;
        puVar14 = puVar3;
LAB_0045d4a6:
        iVar10 = 8;
        break;
      case 0x187:
        lVar11 = 0x1870;
        puVar14 = puVar3;
LAB_0045d44d:
        iVar10 = 0x10;
        break;
      case 0x188:
        lVar11 = 0x1880;
        puVar14 = puVar3;
LAB_0045d459:
        iVar10 = 0x20;
        break;
      case 0x18a:
        iVar10 = 0x100;
        lVar11 = 0x18a0;
        puVar14 = puVar3;
        break;
      case 0x18b:
        iVar10 = 0x200;
        lVar11 = 0x18b0;
        puVar14 = puVar3;
      }
      break;
    }
switchD_0045d5db_caseD_17f:
    uVar13 = (this->super_UDMFParserBase).namespace_bits;
    if ((uVar13 & 0x70) == 0) goto switchD_0045d5b1_caseD_175;
    switch(key.Index) {
    case 0x171:
      iVar10 = 0x2000;
      lVar11 = 0x1710;
      break;
    case 0x172:
      iVar10 = 0x4000;
      lVar11 = 0x1720;
      break;
    case 0x173:
      iVar10 = 0x8000;
      lVar11 = 0x1730;
      break;
    case 0x174:
      iVar10 = 0x10000;
      lVar11 = 0x1740;
      break;
    case 0x175:
    case 0x176:
    case 0x17c:
    case 0x17d:
    case 0x17e:
    case 0x17f:
    case 0x182:
    case 0x183:
    case 0x184:
    case 0x185:
    case 0x186:
    case 0x187:
    case 0x188:
      goto switchD_0045d5b1_caseD_175;
    case 0x177:
      iVar10 = 0x80000;
      lVar11 = 6000;
      break;
    case 0x178:
      iVar10 = 0x100000;
      lVar11 = 0x1780;
      break;
    case 0x179:
      iVar10 = 0x200000;
      lVar11 = 0x1790;
      break;
    case 0x17a:
      iVar10 = 0x400000;
      lVar11 = 0x17a0;
      break;
    case 0x17b:
      iVar10 = 0x800000;
      lVar11 = 0x17b0;
      break;
    case 0x180:
      iVar10 = UDMFParserBase::CheckInt
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[0x180].Text);
      ld->locknumber = iVar10;
      goto LAB_0045d303;
    case 0x181:
      iVar10 = 0x10000000;
      lVar11 = 0x1810;
      break;
    case 0x189:
      iVar10 = 0x80;
      lVar11 = 0x1890;
      puVar14 = puVar3;
      break;
    default:
      switch(key.Index) {
      case 0x1c8:
        iVar10 = 0x1000000;
        lVar11 = 0x1c80;
        break;
      case 0x1c9:
        iVar10 = 0x2000000;
        lVar11 = 0x1c90;
        break;
      case 0x1ca:
        goto switchD_0045d5b1_caseD_175;
      case 0x1cb:
        iVar10 = 0x4000000;
        lVar11 = 0x1cb0;
        break;
      case 0x1cc:
        iVar10 = 0x8000000;
        lVar11 = 0x1cc0;
        break;
      case 0x1cd:
        local_150 = UDMFParserBase::CheckString
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1cd].Text);
        iVar10 = strcasecmp(local_150,"translucent");
        if (iVar10 == 0) {
          pbVar4 = (byte *)((long)&ld->flags + 1);
          *pbVar4 = *pbVar4 & 0xfb;
        }
        else {
          iVar10 = strcasecmp(local_150,"add");
          if (iVar10 == 0) {
            pbVar4 = (byte *)((long)&ld->flags + 1);
            *pbVar4 = *pbVar4 | 4;
          }
          else {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Unknown value \"%s\" for \'renderstyle\'\n",local_150);
          }
        }
        goto LAB_0045d303;
      default:
        if (key.Index == 0x120) {
          pcVar12 = UDMFParserBase::CheckString
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x120].Text);
          FString::operator=(&tagstring,pcVar12);
          uVar13 = (this->super_UDMFParserBase).namespace_bits;
        }
        else if (key.Index == 0xe6) {
          dVar15 = UDMFParserBase::CheckFloat
                             (&this->super_UDMFParserBase,FName::NameData.NameArray[0xe6].Text);
          ld->alpha = dVar15;
          goto LAB_0045d303;
        }
switchD_0045d5b1_caseD_175:
        FVar8.Index = key.Index;
        if (((uVar13 & 0x30) != 0) &&
           (iVar10 = strncasecmp("user_",FName::NameData.NameArray[key.Index].Text,5), iVar10 == 0))
        {
          local_154.Index = FVar8.Index;
          AddUserKey(this,&local_154,0,index);
        }
        goto LAB_0045d303;
      }
    }
  }
  UDMFParserBase::Flag<unsigned_int>
            (&this->super_UDMFParserBase,puVar14,iVar10,
             *(char **)((long)&(FName::NameData.NameArray)->Text + lVar11));
  goto LAB_0045d303;
}

Assistant:

void ParseLinedef(line_t *ld, int index)
	{
		bool passuse = false;
		bool strifetrans = false;
		bool strifetrans2 = false;
		FString arg0str, arg1str;
		int lineid = -1;	// forZDoomTranslated namespace
		FString tagstring;

		memset(ld, 0, sizeof(*ld));
		ld->alpha = 1.;
		ld->portalindex = UINT_MAX;
		ld->sidedef[0] = ld->sidedef[1] = NULL;
		if (level.flags2 & LEVEL2_CLIPMIDTEX) ld->flags |= ML_CLIP_MIDTEX;
		if (level.flags2 & LEVEL2_WRAPMIDTEX) ld->flags |= ML_WRAP_MIDTEX;
		if (level.flags2 & LEVEL2_CHECKSWITCHRANGE) ld->flags |= ML_CHECKSWITCHRANGE;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();

			// This switch contains all keys of the UDMF base spec
			switch(key)
			{
			case NAME_V1:
				ld->v1 = (vertex_t*)(intptr_t)CheckInt(key);	// must be relocated later
				continue;

			case NAME_V2:
				ld->v2 = (vertex_t*)(intptr_t)CheckInt(key);	// must be relocated later
				continue;

			case NAME_Special:
				ld->special = CheckInt(key);
				if (namespc == NAME_Hexen)
				{
					if (ld->special < 0 || ld->special > 140 || !HexenLineSpecialOk[ld->special])
						ld->special = 0;	// NULL all specials which don't exist in Hexen
				}

				continue;

			case NAME_Id:
				lineid = CheckInt(key);
				tagManager.AddLineID(index, lineid);
				continue;

			case NAME_Sidefront:
				ld->sidedef[0] = (side_t*)(intptr_t)(1 + CheckInt(key));
				continue;

			case NAME_Sideback:
				ld->sidedef[1] = (side_t*)(intptr_t)(1 + CheckInt(key));
				continue;

			case NAME_Arg0:
			case NAME_Arg1:
			case NAME_Arg2:
			case NAME_Arg3:
			case NAME_Arg4:
				ld->args[int(key)-int(NAME_Arg0)] = CheckInt(key);
				continue;

			case NAME_Arg0Str:
				CHECK_N(Zd);
				arg0str = CheckString(key);
				continue;

			case NAME_Arg1Str:
				CHECK_N(Zd);
				arg1str = CheckString(key);
				continue;

			case NAME_Blocking:
				Flag(ld->flags, ML_BLOCKING, key); 
				continue;

			case NAME_Blockmonsters:
				Flag(ld->flags, ML_BLOCKMONSTERS, key); 
				continue;

			case NAME_Twosided:
				Flag(ld->flags, ML_TWOSIDED, key); 
				continue;

			case NAME_Dontpegtop:
				Flag(ld->flags, ML_DONTPEGTOP, key); 
				continue;

			case NAME_Dontpegbottom:
				Flag(ld->flags, ML_DONTPEGBOTTOM, key); 
				continue;

			case NAME_Secret:
				Flag(ld->flags, ML_SECRET, key); 
				continue;

			case NAME_Blocksound:
				Flag(ld->flags, ML_SOUNDBLOCK, key); 
				continue;

			case NAME_Dontdraw:
				Flag(ld->flags, ML_DONTDRAW, key); 
				continue;

			case NAME_Mapped:
				Flag(ld->flags, ML_MAPPED, key); 
				continue;

			case NAME_Jumpover:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(ld->flags, ML_RAILING, key); 
				continue;

			case NAME_Blockfloaters:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(ld->flags, ML_BLOCK_FLOATERS, key); 
				continue;

			case NAME_Translucent:
				CHECK_N(St | Zd | Zdt | Va)
				strifetrans = CheckBool(key); 
				continue;

			case NAME_Transparent:
				CHECK_N(St | Zd | Zdt | Va)
				strifetrans2 = CheckBool(key); 
				continue;

			case NAME_Passuse:
				CHECK_N(Dm | Zd | Zdt | Va)
				passuse = CheckBool(key); 
				continue;

			default:
				break;
			}

			// This switch contains all keys of the UDMF base spec which only apply to Hexen format specials
			if (!isTranslated) switch (key)
			{
			case NAME_Playercross:
				Flag(ld->activation, SPAC_Cross, key); 
				continue;

			case NAME_Playeruse:
				Flag(ld->activation, SPAC_Use, key); 
				continue;

			case NAME_Playeruseback:
				Flag(ld->activation, SPAC_UseBack, key); 
				continue;

			case NAME_Monstercross:
				Flag(ld->activation, SPAC_MCross, key); 
				continue;

			case NAME_Impact:
				Flag(ld->activation, SPAC_Impact, key); 
				continue;

			case NAME_Playerpush:
				Flag(ld->activation, SPAC_Push, key); 
				continue;

			case NAME_Missilecross:
				Flag(ld->activation, SPAC_PCross, key); 
				continue;

			case NAME_Monsteruse:
				Flag(ld->activation, SPAC_MUse, key); 
				continue;

			case NAME_Monsterpush:
				Flag(ld->activation, SPAC_MPush, key); 
				continue;

			case NAME_Repeatspecial:
				Flag(ld->flags, ML_REPEAT_SPECIAL, key); 
				continue;

			default:
				break;
			}

			// This switch contains all keys which are ZDoom specific
			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
			case NAME_Alpha:
				ld->setAlpha(CheckFloat(key));
				continue;

			case NAME_Renderstyle:
			{
				const char *str = CheckString(key);
				if (!stricmp(str, "translucent")) ld->flags &= ~ML_ADDTRANS;
				else if (!stricmp(str, "add")) ld->flags |= ML_ADDTRANS;
				else sc.ScriptMessage("Unknown value \"%s\" for 'renderstyle'\n", str);
				continue;
			}

			case NAME_Anycross:
				Flag(ld->activation, SPAC_AnyCross, key); 
				continue;

			case NAME_Monsteractivate:
				Flag(ld->flags, ML_MONSTERSCANACTIVATE, key); 
				continue;

			case NAME_Blockplayers:
				Flag(ld->flags, ML_BLOCK_PLAYERS, key); 
				continue;

			case NAME_Blockeverything:
				Flag(ld->flags, ML_BLOCKEVERYTHING, key); 
				continue;

			case NAME_Zoneboundary:
				Flag(ld->flags, ML_ZONEBOUNDARY, key); 
				continue;

			case NAME_Clipmidtex:
				Flag(ld->flags, ML_CLIP_MIDTEX, key); 
				continue;

			case NAME_Wrapmidtex:
				Flag(ld->flags, ML_WRAP_MIDTEX, key); 
				continue;

			case NAME_Midtex3d:
				Flag(ld->flags, ML_3DMIDTEX, key); 
				continue;

			case NAME_Checkswitchrange:
				Flag(ld->flags, ML_CHECKSWITCHRANGE, key); 
				continue;

			case NAME_Firstsideonly:
				Flag(ld->flags, ML_FIRSTSIDEONLY, key); 
				continue;

			case NAME_blockprojectiles:
				Flag(ld->flags, ML_BLOCKPROJECTILE, key); 
				continue;

			case NAME_blockuse:
				Flag(ld->flags, ML_BLOCKUSE, key); 
				continue;

			case NAME_blocksight:
				Flag(ld->flags, ML_BLOCKSIGHT, key); 
				continue;
			
			case NAME_blockhitscan:
				Flag(ld->flags, ML_BLOCKHITSCAN, key); 
				continue;
			
			// [TP] Locks the special with a key
			case NAME_Locknumber:
				ld->locknumber = CheckInt(key);
				continue;

			// [TP] Causes a 3d midtex to behave like an impassible line
			case NAME_Midtex3dimpassible:
				Flag(ld->flags, ML_3DMIDTEX_IMPASS, key);
				continue;

			case NAME_MoreIds:
				// delay parsing of the tag string until parsing of the sector is complete
				// This ensures that the ID is always the first tag in the list.
				tagstring = CheckString(key);
				break;


			default:
				break;
			}


			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Line, index);
			}
		}

		if (tagstring.IsNotEmpty())
		{
			FScanner sc;
			sc.OpenString("tagstring", tagstring);
			// scan the string as long as valid numbers can be found
			while (sc.CheckNumber())
			{
				if (sc.Number != 0)	tagManager.AddLineID(index, sc.Number);
			}
		}

		if (isTranslated)
		{
			int saved = ld->flags;

			maplinedef_t mld;
			memset(&mld, 0, sizeof(mld));
			mld.special = ld->special;
			mld.tag = ld->args[0];
			P_TranslateLineDef(ld, &mld);
			ld->flags = saved | (ld->flags&(ML_MONSTERSCANACTIVATE|ML_REPEAT_SPECIAL|ML_FIRSTSIDEONLY));
		}
		if (passuse && (ld->activation & SPAC_Use)) 
		{
			ld->activation = (ld->activation & ~SPAC_Use) | SPAC_UseThrough;
		}
		if (strifetrans && ld->alpha == 1.)
		{
			ld->alpha = 0.75;
		}
		if (strifetrans2 && ld->alpha == OPAQUE)
		{
			ld->alpha = 0.25;
		}
		if (ld->sidedef[0] == NULL)
		{
			ld->sidedef[0] = (side_t*)(intptr_t)(1);
			Printf("Line %d has no first side.\n", index);
		}
		if (arg0str.IsNotEmpty() && (P_IsACSSpecial(ld->special) || ld->special == 0))
		{
			ld->args[0] = -FName(arg0str);
		}
		if (arg1str.IsNotEmpty() && (P_IsThingSpecial(ld->special) || ld->special == 0))
		{
			ld->args[1] = -FName(arg1str);
		}
		if ((ld->flags & ML_3DMIDTEX_IMPASS) && !(ld->flags & ML_3DMIDTEX)) // [TP]
		{
			Printf ("Line %d has midtex3dimpassible without midtex3d.\n", index);
		}
	}